

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int32_t __thiscall cppnet::Bitmap::GetMinAfter(Bitmap *this,uint32_t index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  ulong *puVar8;
  float fVar9;
  float fVar10;
  int64_t cur_bitmap;
  uint32_t target_vec_index;
  uint32_t next_vec_index;
  int32_t temp_vec_bitmap;
  int32_t cur_step;
  int64_t cur_bitmap_1;
  uint32_t ret;
  uint32_t bitmap_index;
  uint32_t index_local;
  Bitmap *this_local;
  
  sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->_bitmap);
  if ((sVar5 << 6 <= (ulong)index) || (bVar1 = Empty(this), bVar1)) {
    this_local._4_4_ = -1;
  }
  else {
    uVar2 = index >> 6;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&this->_bitmap,(ulong)uVar2);
    if (*pvVar6 != 0) {
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&this->_bitmap,(ulong)uVar2);
      iVar3 = index + uVar2 * -0x40;
      uVar7 = *pvVar6 >> ((byte)iVar3 & 0x3f);
      if (uVar7 != 0) {
        fVar9 = log2f((float)(long)(uVar7 & -uVar7));
        return (int)(long)fVar9 + uVar2 * 0x40 + iVar3;
      }
    }
    uVar4 = this->_vec_bitmap >> ((byte)uVar2 & 0x1f);
    if (uVar4 == 0) {
      this_local._4_4_ = -1;
    }
    else {
      fVar9 = log2f((float)(int)((uVar4 & -uVar4) + 1));
      uVar4 = (int)(long)fVar9 + uVar2;
      if (uVar4 == uVar2) {
        this_local._4_4_ = -1;
      }
      else {
        sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->_bitmap);
        if (uVar4 < sVar5) {
          puVar8 = (ulong *)std::vector<long,_std::allocator<long>_>::operator[]
                                      (&this->_bitmap,(ulong)uVar4);
          fVar10 = log2f((float)(long)((*puVar8 & -*puVar8) + 1));
          this_local._4_4_ = (int)(long)fVar10 + (int)(long)fVar9 * 0x40 + uVar2 * 0x40;
        }
        else {
          this_local._4_4_ = -1;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t Bitmap::GetMinAfter(uint32_t index) {
    // get next bit.
    if (index >= _bitmap.size() * __step_size || Empty()) {
        return -1;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // filter smaller bitmap index
    uint32_t ret = bitmap_index * __step_size;

    // find current uint64_t have next 1?
    if (_bitmap[bitmap_index] != 0) {
        int64_t cur_bitmap = _bitmap[bitmap_index];
        int32_t cur_step = index - ret;
        cur_bitmap = cur_bitmap >> cur_step;

        // don't have next 1
        if (cur_bitmap == 0) {
            ret += __step_size;

        // find next 1
        } else {
            ret += cur_step;
            ret += (uint32_t)std::log2f(float(cur_bitmap & (-cur_bitmap)));
            return ret;
        }

    } else {
        ret += __step_size;
    }

    // find next used vector index 
    int32_t temp_vec_bitmap = _vec_bitmap >> bitmap_index;
    if (temp_vec_bitmap == 0) {
        return -1;
    }

    uint32_t next_vec_index = (uint32_t)std::log2f(float((temp_vec_bitmap & (-temp_vec_bitmap)) + 1));
    uint32_t target_vec_index = next_vec_index + bitmap_index;
    if (target_vec_index == bitmap_index) {
        return -1;
    }
    
    if (target_vec_index >= _bitmap.size()) {
        return -1;
    }
    
    int64_t cur_bitmap = _bitmap[target_vec_index];
    ret += (next_vec_index - 1) * __step_size;
    ret += (uint32_t)std::log2f(float((cur_bitmap & (-cur_bitmap)) + 1));

    return ret;
}